

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWPackage.cxx
# Opt level: O0

void __thiscall cmCPackIFWPackage::GeneratePackageFile(cmCPackIFWPackage *this)

{
  cmCPackLog *this_00;
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  reference ppcVar4;
  pointer pDVar5;
  long lVar6;
  reference ppDVar7;
  ostream *poVar8;
  char *msg;
  size_type sVar9;
  reference pvVar10;
  reference pbVar11;
  bool local_13a3;
  bool local_13a2;
  bool local_1383;
  bool local_1382;
  bool local_1361;
  allocator<char> local_12b1;
  string local_12b0;
  allocator<char> local_1289;
  string local_1288;
  allocator<char> local_1261;
  string local_1260;
  allocator<char> local_1239;
  string local_1238;
  allocator<char> local_1211;
  string local_1210;
  allocator<char> local_11e9;
  string local_11e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_11c8;
  allocator<char> local_11a1;
  string local_11a0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1180;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1178;
  iterator it_2;
  ostringstream replaces;
  allocator<char> local_ff1;
  string local_ff0;
  allocator<char> local_fc9;
  string local_fc8;
  ulong local_fa8;
  size_t i_1;
  string local_f98;
  Status local_f78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f70;
  undefined1 local_f50 [8];
  string path_3;
  string name_3;
  size_t i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  licenses;
  undefined1 local_ed0 [8];
  ostringstream cmCPackLog_msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d58;
  allocator<char> local_d31;
  string local_d30;
  string local_d10;
  _Self local_cf0;
  string local_ce8;
  _Rb_tree_const_iterator<cmCPackIFWPackage::DependenceStruct> local_cc8;
  iterator it_1;
  ostringstream dependencies_1;
  DependenceStruct *aad;
  iterator __end1_6;
  iterator __begin1_6;
  set<cmCPackIFWPackage::DependenceStruct_*,_std::less<cmCPackIFWPackage::DependenceStruct_*>,_std::allocator<cmCPackIFWPackage::DependenceStruct_*>_>
  *__range1_6;
  set<cmCPackIFWPackage::DependenceStruct,_std::less<cmCPackIFWPackage::DependenceStruct>,_std::allocator<cmCPackIFWPackage::DependenceStruct>_>
  compAutoDepSet;
  allocator<char> local_ac1;
  string local_ac0;
  string local_aa0;
  _Self local_a80;
  string local_a78;
  _Rb_tree_const_iterator<cmCPackIFWPackage::DependenceStruct> local_a58;
  iterator it;
  ostringstream dependencies;
  DependenceStruct local_8c8;
  cmCPackIFWPackage *local_880;
  cmCPackIFWPackage *d_1;
  iterator __end1_5;
  iterator __begin1_5;
  set<cmCPackIFWPackage_*,_std::less<cmCPackIFWPackage_*>,_std::allocator<cmCPackIFWPackage_*>_>
  *__range1_5;
  DependenceStruct *ad;
  iterator __end1_4;
  iterator __begin1_4;
  set<cmCPackIFWPackage::DependenceStruct_*,_std::less<cmCPackIFWPackage::DependenceStruct_*>,_std::allocator<cmCPackIFWPackage::DependenceStruct_*>_>
  *__range1_4;
  set<cmCPackIFWPackage::DependenceStruct,_std::less<cmCPackIFWPackage::DependenceStruct>,_std::allocator<cmCPackIFWPackage::DependenceStruct>_>
  compDepSet;
  undefined1 local_7f8 [5];
  bool warnUnsupportedNames;
  bool hyphensInNamesUnsupported;
  reference local_7d8;
  string *translation_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_1;
  string local_7b0;
  Status local_790;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_788;
  undefined1 local_768 [8];
  string path_2;
  string name_2;
  string *translation;
  iterator __end1_3;
  iterator __begin1_3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  translations;
  string local_6e8;
  reference local_6c8;
  string *userInterface_1;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  string local_6a0;
  Status local_680;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_678;
  undefined1 local_658 [8];
  string path_1;
  string name_1;
  string *userInterface;
  iterator __end1_2;
  iterator __begin1_2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  userInterfaces;
  string local_5d8;
  Status local_5b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b0;
  undefined1 local_590 [8];
  string path;
  string name;
  string local_548;
  cmTimestamp local_521;
  string local_520;
  allocator<char> local_4f9;
  string local_4f8;
  allocator<char> local_4d1;
  string local_4d0;
  allocator<char> local_4a9;
  string local_4a8;
  allocator<char> local_481;
  string local_480;
  allocator<char> local_459;
  string local_458;
  allocator<char> local_431;
  string local_430;
  reference local_410;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *d;
  iterator __end1_1;
  iterator __begin1_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1_1;
  string local_3e8;
  reference local_3c8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *dn;
  iterator __end1;
  iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1;
  string local_3a0;
  undefined1 local_380 [8];
  cmXMLWriter xout;
  undefined1 local_308 [8];
  cmGeneratedFileStream fout;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  cmCPackIFWPackage *local_10;
  cmCPackIFWPackage *this_local;
  
  local_10 = this;
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) != 0) {
    if (this->Installer == (cmCPackIFWInstaller *)0x0) {
      if ((this->super_cmCPackIFWCommon).Generator != (cmCPackIFWGenerator *)0x0) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &fout.field_0x260,
                       &(((this->super_cmCPackIFWCommon).Generator)->super_cmCPackGenerator).
                        toplevel,"/packages/");
        std::operator+(&local_80,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &fout.field_0x260,&this->Name);
        std::__cxx11::string::operator=((string *)&this->Directory,(string *)&local_80);
        std::__cxx11::string::~string((string *)&local_80);
        std::__cxx11::string::~string((string *)&fout.field_0x260);
      }
    }
    else {
      std::operator+(&local_50,&this->Installer->Directory,"/packages/");
      std::operator+(&local_30,&local_50,&this->Name);
      std::__cxx11::string::operator=((string *)&this->Directory,(string *)&local_30);
      std::__cxx11::string::~string((string *)&local_30);
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &xout.ElementOpen,&this->Directory,"/meta/package.xml");
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_308,(string *)&xout.ElementOpen,false,None);
  std::__cxx11::string::~string((string *)&xout.ElementOpen);
  cmXMLWriter::cmXMLWriter((cmXMLWriter *)local_380,(ostream *)local_308,0);
  cmXMLWriter::StartDocument((cmXMLWriter *)local_380,"UTF-8");
  cmCPackIFWCommon::WriteGeneratedByToStrim(&this->super_cmCPackIFWCommon,(cmXMLWriter *)local_380);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3a0,"Package",(allocator<char> *)((long)&__range1 + 7));
  cmXMLWriter::StartElement((cmXMLWriter *)local_380,&local_3a0);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::begin(&this->DisplayName);
  dn = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::end(&this->DisplayName);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&dn), bVar1) {
    local_3c8 = std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator*(&__end1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3e8,"DisplayName",(allocator<char> *)((long)&__range1_1 + 7));
    cmXMLWriter::StartElement((cmXMLWriter *)local_380,&local_3e8);
    std::__cxx11::string::~string((string *)&local_3e8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range1_1 + 7));
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      cmXMLWriter::Attribute<std::__cxx11::string>
                ((cmXMLWriter *)local_380,"xml:lang",&local_3c8->first);
    }
    cmXMLWriter::Content<std::__cxx11::string>((cmXMLWriter *)local_380,&local_3c8->second);
    cmXMLWriter::EndElement((cmXMLWriter *)local_380);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++(&__end1);
  }
  __end1_1 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::begin(&this->Description);
  d = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *)std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end(&this->Description);
  while (bVar1 = std::operator!=(&__end1_1,(_Self *)&d), bVar1) {
    local_410 = std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator*(&__end1_1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_430,"Description",&local_431);
    cmXMLWriter::StartElement((cmXMLWriter *)local_380,&local_430);
    std::__cxx11::string::~string((string *)&local_430);
    std::allocator<char>::~allocator(&local_431);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      cmXMLWriter::Attribute<std::__cxx11::string>
                ((cmXMLWriter *)local_380,"xml:lang",&local_410->first);
    }
    cmXMLWriter::Content<std::__cxx11::string>((cmXMLWriter *)local_380,&local_410->second);
    cmXMLWriter::EndElement((cmXMLWriter *)local_380);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++(&__end1_1);
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_458,"UpdateText",&local_459)
    ;
    cmXMLWriter::Element<std::__cxx11::string>
              ((cmXMLWriter *)local_380,&local_458,&this->UpdateText);
    std::__cxx11::string::~string((string *)&local_458);
    std::allocator<char>::~allocator(&local_459);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_480,"Name",&local_481);
  cmXMLWriter::Element<std::__cxx11::string>((cmXMLWriter *)local_380,&local_480,&this->Name);
  std::__cxx11::string::~string((string *)&local_480);
  std::allocator<char>::~allocator(&local_481);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4a8,"Version",&local_4a9);
  cmXMLWriter::Element<std::__cxx11::string>((cmXMLWriter *)local_380,&local_4a8,&this->Version);
  std::__cxx11::string::~string((string *)&local_4a8);
  std::allocator<char>::~allocator(&local_4a9);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4d0,"ReleaseDate",&local_4d1);
    cmXMLWriter::Element<std::__cxx11::string>
              ((cmXMLWriter *)local_380,&local_4d0,&this->ReleaseDate);
    std::__cxx11::string::~string((string *)&local_4d0);
    std::allocator<char>::~allocator(&local_4d1);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4f8,"ReleaseDate",&local_4f9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_548,"%Y-%m-%d",(allocator<char> *)(name.field_2._M_local_buf + 0xf))
    ;
    cmTimestamp::CurrentTime(&local_520,&local_521,&local_548,true);
    cmXMLWriter::Element<std::__cxx11::string>((cmXMLWriter *)local_380,&local_4f8,&local_520);
    std::__cxx11::string::~string((string *)&local_520);
    std::__cxx11::string::~string((string *)&local_548);
    std::allocator<char>::~allocator((allocator<char> *)(name.field_2._M_local_buf + 0xf));
    std::__cxx11::string::~string((string *)&local_4f8);
    std::allocator<char>::~allocator(&local_4f9);
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    cmsys::SystemTools::GetFilenameName((string *)((long)&path.field_2 + 8),&this->Script);
    std::operator+(&local_5b0,&this->Directory,"/meta/");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_590,
                   &local_5b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&path.field_2 + 8));
    std::__cxx11::string::~string((string *)&local_5b0);
    local_5b8 = cmsys::SystemTools::CopyFileIfDifferent(&this->Script,(string *)local_590);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_5d8,"Script",
               (allocator<char> *)
               ((long)&userInterfaces.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    cmXMLWriter::Element<std::__cxx11::string>
              ((cmXMLWriter *)local_380,&local_5d8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&path.field_2 + 8));
    std::__cxx11::string::~string((string *)&local_5d8);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&userInterfaces.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::__cxx11::string::~string((string *)local_590);
    std::__cxx11::string::~string((string *)(path.field_2._M_local_buf + 8));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&__range1_2,&this->UserInterfaces);
  __end1_2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&__range1_2);
  userInterface =
       (string *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__range1_2);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_2,
                            (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&userInterface), bVar1) {
    pbVar11 = __gnu_cxx::
              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator*(&__end1_2);
    cmsys::SystemTools::GetFilenameName((string *)((long)&path_1.field_2 + 8),pbVar11);
    std::operator+(&local_678,&this->Directory,"/meta/");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_658,
                   &local_678,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&path_1.field_2 + 8));
    std::__cxx11::string::~string((string *)&local_678);
    local_680 = cmsys::SystemTools::CopyFileIfDifferent(pbVar11,(string *)local_658);
    std::__cxx11::string::operator=((string *)pbVar11,(string *)(path_1.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_658);
    std::__cxx11::string::~string((string *)(path_1.field_2._M_local_buf + 8));
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1_2);
  }
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&__range1_2);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6a0,"UserInterfaces",(allocator<char> *)((long)&__range2 + 7));
    cmXMLWriter::StartElement((cmXMLWriter *)local_380,&local_6a0);
    std::__cxx11::string::~string((string *)&local_6a0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&__range1_2);
    userInterface_1 =
         (string *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__range1_2);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&userInterface_1), bVar1) {
      local_6c8 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&__end2);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_6e8,"UserInterface",
                 (allocator<char> *)
                 ((long)&translations.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      cmXMLWriter::Element<std::__cxx11::string>((cmXMLWriter *)local_380,&local_6e8,local_6c8);
      std::__cxx11::string::~string((string *)&local_6e8);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&translations.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    cmXMLWriter::EndElement((cmXMLWriter *)local_380);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&__range1_3,&this->Translations);
  __end1_3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&__range1_3);
  translation = (string *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&__range1_3);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_3,
                            (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&translation), bVar1) {
    pbVar11 = __gnu_cxx::
              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator*(&__end1_3);
    cmsys::SystemTools::GetFilenameName((string *)((long)&path_2.field_2 + 8),pbVar11);
    std::operator+(&local_788,&this->Directory,"/meta/");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_768,
                   &local_788,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&path_2.field_2 + 8));
    std::__cxx11::string::~string((string *)&local_788);
    local_790 = cmsys::SystemTools::CopyFileIfDifferent(pbVar11,(string *)local_768);
    std::__cxx11::string::operator=((string *)pbVar11,(string *)(path_2.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_768);
    std::__cxx11::string::~string((string *)(path_2.field_2._M_local_buf + 8));
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1_3);
  }
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&__range1_3);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_7b0,"Translations",(allocator<char> *)((long)&__range2_1 + 7));
    cmXMLWriter::StartElement((cmXMLWriter *)local_380,&local_7b0);
    std::__cxx11::string::~string((string *)&local_7b0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range2_1 + 7));
    __end2_1 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&__range1_3);
    translation_1 =
         (string *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__range1_3);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)&translation_1), bVar1) {
      local_7d8 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&__end2_1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_7f8,"Translation",
                 (allocator<char> *)
                 ((long)&compDepSet._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
      cmXMLWriter::Element<std::__cxx11::string>
                ((cmXMLWriter *)local_380,(string *)local_7f8,local_7d8);
      std::__cxx11::string::~string((string *)local_7f8);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&compDepSet._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2_1);
    }
    cmXMLWriter::EndElement((cmXMLWriter *)local_380);
  }
  local_1361 = false;
  if ((this->super_cmCPackIFWCommon).Generator != (cmCPackIFWGenerator *)0x0) {
    uVar2 = std::__cxx11::string::empty();
    local_1361 = false;
    if ((uVar2 & 1) == 0) {
      local_1361 = cmCPackIFWCommon::IsVersionLess(&this->super_cmCPackIFWCommon,"3.1");
    }
  }
  compDepSet._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ = local_1361;
  compDepSet._M_t._M_impl.super__Rb_tree_header._M_node_count._5_1_ = 0;
  std::
  set<cmCPackIFWPackage::DependenceStruct,_std::less<cmCPackIFWPackage::DependenceStruct>,_std::allocator<cmCPackIFWPackage::DependenceStruct>_>
  ::set((set<cmCPackIFWPackage::DependenceStruct,_std::less<cmCPackIFWPackage::DependenceStruct>,_std::allocator<cmCPackIFWPackage::DependenceStruct>_>
         *)&__range1_4);
  __end1_4 = std::
             set<cmCPackIFWPackage::DependenceStruct_*,_std::less<cmCPackIFWPackage::DependenceStruct_*>,_std::allocator<cmCPackIFWPackage::DependenceStruct_*>_>
             ::begin(&this->AlienDependencies);
  ad = (DependenceStruct *)
       std::
       set<cmCPackIFWPackage::DependenceStruct_*,_std::less<cmCPackIFWPackage::DependenceStruct_*>,_std::allocator<cmCPackIFWPackage::DependenceStruct_*>_>
       ::end(&this->AlienDependencies);
  while (bVar1 = std::operator!=(&__end1_4,(_Self *)&ad), bVar1) {
    ppDVar7 = std::_Rb_tree_const_iterator<cmCPackIFWPackage::DependenceStruct_*>::operator*
                        (&__end1_4);
    std::
    set<cmCPackIFWPackage::DependenceStruct,_std::less<cmCPackIFWPackage::DependenceStruct>,_std::allocator<cmCPackIFWPackage::DependenceStruct>_>
    ::insert((set<cmCPackIFWPackage::DependenceStruct,_std::less<cmCPackIFWPackage::DependenceStruct>,_std::allocator<cmCPackIFWPackage::DependenceStruct>_>
              *)&__range1_4,*ppDVar7);
    std::_Rb_tree_const_iterator<cmCPackIFWPackage::DependenceStruct_*>::operator++(&__end1_4);
  }
  __end1_5 = std::
             set<cmCPackIFWPackage_*,_std::less<cmCPackIFWPackage_*>,_std::allocator<cmCPackIFWPackage_*>_>
             ::begin(&this->Dependencies);
  d_1 = (cmCPackIFWPackage *)
        std::
        set<cmCPackIFWPackage_*,_std::less<cmCPackIFWPackage_*>,_std::allocator<cmCPackIFWPackage_*>_>
        ::end(&this->Dependencies);
  while (bVar1 = std::operator!=(&__end1_5,(_Self *)&d_1), bVar1) {
    ppcVar4 = std::_Rb_tree_const_iterator<cmCPackIFWPackage_*>::operator*(&__end1_5);
    local_880 = *ppcVar4;
    DependenceStruct::DependenceStruct(&local_8c8,&local_880->Name);
    std::
    set<cmCPackIFWPackage::DependenceStruct,_std::less<cmCPackIFWPackage::DependenceStruct>,_std::allocator<cmCPackIFWPackage::DependenceStruct>_>
    ::insert((set<cmCPackIFWPackage::DependenceStruct,_std::less<cmCPackIFWPackage::DependenceStruct>,_std::allocator<cmCPackIFWPackage::DependenceStruct>_>
              *)&__range1_4,&local_8c8);
    DependenceStruct::~DependenceStruct(&local_8c8);
    std::_Rb_tree_const_iterator<cmCPackIFWPackage_*>::operator++(&__end1_5);
  }
  bVar1 = std::
          set<cmCPackIFWPackage::DependenceStruct,_std::less<cmCPackIFWPackage::DependenceStruct>,_std::allocator<cmCPackIFWPackage::DependenceStruct>_>
          ::empty((set<cmCPackIFWPackage::DependenceStruct,_std::less<cmCPackIFWPackage::DependenceStruct>,_std::allocator<cmCPackIFWPackage::DependenceStruct>_>
                   *)&__range1_4);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&it);
    local_a58._M_node =
         (_Base_ptr)
         std::
         set<cmCPackIFWPackage::DependenceStruct,_std::less<cmCPackIFWPackage::DependenceStruct>,_std::allocator<cmCPackIFWPackage::DependenceStruct>_>
         ::begin((set<cmCPackIFWPackage::DependenceStruct,_std::less<cmCPackIFWPackage::DependenceStruct>,_std::allocator<cmCPackIFWPackage::DependenceStruct>_>
                  *)&__range1_4);
    local_1382 = false;
    if ((compDepSet._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ & 1) != 0) {
      pDVar5 = std::_Rb_tree_const_iterator<cmCPackIFWPackage::DependenceStruct>::operator->
                         (&local_a58);
      lVar6 = std::__cxx11::string::find((char)pDVar5,0x2d);
      local_1382 = lVar6 != -1;
    }
    compDepSet._M_t._M_impl.super__Rb_tree_header._M_node_count._5_1_ =
         compDepSet._M_t._M_impl.super__Rb_tree_header._M_node_count._5_1_ & 1 | local_1382;
    pDVar5 = std::_Rb_tree_const_iterator<cmCPackIFWPackage::DependenceStruct>::operator->
                       (&local_a58);
    DependenceStruct::NameWithCompare_abi_cxx11_(&local_a78,pDVar5);
    std::operator<<((ostream *)&it,(string *)&local_a78);
    std::__cxx11::string::~string((string *)&local_a78);
    std::_Rb_tree_const_iterator<cmCPackIFWPackage::DependenceStruct>::operator++(&local_a58);
    while( true ) {
      local_a80._M_node =
           (_Base_ptr)
           std::
           set<cmCPackIFWPackage::DependenceStruct,_std::less<cmCPackIFWPackage::DependenceStruct>,_std::allocator<cmCPackIFWPackage::DependenceStruct>_>
           ::end((set<cmCPackIFWPackage::DependenceStruct,_std::less<cmCPackIFWPackage::DependenceStruct>,_std::allocator<cmCPackIFWPackage::DependenceStruct>_>
                  *)&__range1_4);
      bVar1 = std::operator!=(&local_a58,&local_a80);
      if (!bVar1) break;
      local_1383 = false;
      if ((compDepSet._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ & 1) != 0) {
        pDVar5 = std::_Rb_tree_const_iterator<cmCPackIFWPackage::DependenceStruct>::operator->
                           (&local_a58);
        lVar6 = std::__cxx11::string::find((char)pDVar5,0x2d);
        local_1383 = lVar6 != -1;
      }
      compDepSet._M_t._M_impl.super__Rb_tree_header._M_node_count._5_1_ =
           compDepSet._M_t._M_impl.super__Rb_tree_header._M_node_count._5_1_ & 1 | local_1383;
      poVar8 = std::operator<<((ostream *)&it,",");
      pDVar5 = std::_Rb_tree_const_iterator<cmCPackIFWPackage::DependenceStruct>::operator->
                         (&local_a58);
      DependenceStruct::NameWithCompare_abi_cxx11_(&local_aa0,pDVar5);
      std::operator<<(poVar8,(string *)&local_aa0);
      std::__cxx11::string::~string((string *)&local_aa0);
      std::_Rb_tree_const_iterator<cmCPackIFWPackage::DependenceStruct>::operator++(&local_a58);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_ac0,"Dependencies",&local_ac1);
    std::__cxx11::ostringstream::str();
    cmXMLWriter::Element<std::__cxx11::string>
              ((cmXMLWriter *)local_380,&local_ac0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &compAutoDepSet._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::__cxx11::string::~string
              ((string *)&compAutoDepSet._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::__cxx11::string::~string((string *)&local_ac0);
    std::allocator<char>::~allocator(&local_ac1);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&it);
  }
  std::
  set<cmCPackIFWPackage::DependenceStruct,_std::less<cmCPackIFWPackage::DependenceStruct>,_std::allocator<cmCPackIFWPackage::DependenceStruct>_>
  ::set((set<cmCPackIFWPackage::DependenceStruct,_std::less<cmCPackIFWPackage::DependenceStruct>,_std::allocator<cmCPackIFWPackage::DependenceStruct>_>
         *)&__range1_6);
  __end1_6 = std::
             set<cmCPackIFWPackage::DependenceStruct_*,_std::less<cmCPackIFWPackage::DependenceStruct_*>,_std::allocator<cmCPackIFWPackage::DependenceStruct_*>_>
             ::begin(&this->AlienAutoDependOn);
  aad = (DependenceStruct *)
        std::
        set<cmCPackIFWPackage::DependenceStruct_*,_std::less<cmCPackIFWPackage::DependenceStruct_*>,_std::allocator<cmCPackIFWPackage::DependenceStruct_*>_>
        ::end(&this->AlienAutoDependOn);
  while (bVar1 = std::operator!=(&__end1_6,(_Self *)&aad), bVar1) {
    ppDVar7 = std::_Rb_tree_const_iterator<cmCPackIFWPackage::DependenceStruct_*>::operator*
                        (&__end1_6);
    std::
    set<cmCPackIFWPackage::DependenceStruct,_std::less<cmCPackIFWPackage::DependenceStruct>,_std::allocator<cmCPackIFWPackage::DependenceStruct>_>
    ::insert((set<cmCPackIFWPackage::DependenceStruct,_std::less<cmCPackIFWPackage::DependenceStruct>,_std::allocator<cmCPackIFWPackage::DependenceStruct>_>
              *)&__range1_6,*ppDVar7);
    std::_Rb_tree_const_iterator<cmCPackIFWPackage::DependenceStruct_*>::operator++(&__end1_6);
  }
  bVar1 = std::
          set<cmCPackIFWPackage::DependenceStruct,_std::less<cmCPackIFWPackage::DependenceStruct>,_std::allocator<cmCPackIFWPackage::DependenceStruct>_>
          ::empty((set<cmCPackIFWPackage::DependenceStruct,_std::less<cmCPackIFWPackage::DependenceStruct>,_std::allocator<cmCPackIFWPackage::DependenceStruct>_>
                   *)&__range1_6);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&it_1);
    local_cc8._M_node =
         (_Base_ptr)
         std::
         set<cmCPackIFWPackage::DependenceStruct,_std::less<cmCPackIFWPackage::DependenceStruct>,_std::allocator<cmCPackIFWPackage::DependenceStruct>_>
         ::begin((set<cmCPackIFWPackage::DependenceStruct,_std::less<cmCPackIFWPackage::DependenceStruct>,_std::allocator<cmCPackIFWPackage::DependenceStruct>_>
                  *)&__range1_6);
    local_13a2 = false;
    if ((compDepSet._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ & 1) != 0) {
      pDVar5 = std::_Rb_tree_const_iterator<cmCPackIFWPackage::DependenceStruct>::operator->
                         (&local_cc8);
      lVar6 = std::__cxx11::string::find((char)pDVar5,0x2d);
      local_13a2 = lVar6 != -1;
    }
    compDepSet._M_t._M_impl.super__Rb_tree_header._M_node_count._5_1_ =
         compDepSet._M_t._M_impl.super__Rb_tree_header._M_node_count._5_1_ & 1 | local_13a2;
    pDVar5 = std::_Rb_tree_const_iterator<cmCPackIFWPackage::DependenceStruct>::operator->
                       (&local_cc8);
    DependenceStruct::NameWithCompare_abi_cxx11_(&local_ce8,pDVar5);
    std::operator<<((ostream *)&it_1,(string *)&local_ce8);
    std::__cxx11::string::~string((string *)&local_ce8);
    std::_Rb_tree_const_iterator<cmCPackIFWPackage::DependenceStruct>::operator++(&local_cc8);
    while( true ) {
      local_cf0._M_node =
           (_Base_ptr)
           std::
           set<cmCPackIFWPackage::DependenceStruct,_std::less<cmCPackIFWPackage::DependenceStruct>,_std::allocator<cmCPackIFWPackage::DependenceStruct>_>
           ::end((set<cmCPackIFWPackage::DependenceStruct,_std::less<cmCPackIFWPackage::DependenceStruct>,_std::allocator<cmCPackIFWPackage::DependenceStruct>_>
                  *)&__range1_6);
      bVar1 = std::operator!=(&local_cc8,&local_cf0);
      if (!bVar1) break;
      local_13a3 = false;
      if ((compDepSet._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ & 1) != 0) {
        pDVar5 = std::_Rb_tree_const_iterator<cmCPackIFWPackage::DependenceStruct>::operator->
                           (&local_cc8);
        lVar6 = std::__cxx11::string::find((char)pDVar5,0x2d);
        local_13a3 = lVar6 != -1;
      }
      compDepSet._M_t._M_impl.super__Rb_tree_header._M_node_count._5_1_ =
           compDepSet._M_t._M_impl.super__Rb_tree_header._M_node_count._5_1_ & 1 | local_13a3;
      poVar8 = std::operator<<((ostream *)&it_1,",");
      pDVar5 = std::_Rb_tree_const_iterator<cmCPackIFWPackage::DependenceStruct>::operator->
                         (&local_cc8);
      DependenceStruct::NameWithCompare_abi_cxx11_(&local_d10,pDVar5);
      std::operator<<(poVar8,(string *)&local_d10);
      std::__cxx11::string::~string((string *)&local_d10);
      std::_Rb_tree_const_iterator<cmCPackIFWPackage::DependenceStruct>::operator++(&local_cc8);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d30,"AutoDependOn",&local_d31);
    std::__cxx11::ostringstream::str();
    cmXMLWriter::Element<std::__cxx11::string>((cmXMLWriter *)local_380,&local_d30,&local_d58);
    std::__cxx11::string::~string((string *)&local_d58);
    std::__cxx11::string::~string((string *)&local_d30);
    std::allocator<char>::~allocator(&local_d31);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&it_1);
  }
  if ((compDepSet._M_t._M_impl.super__Rb_tree_header._M_node_count._5_1_ & 1) != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_ed0);
    poVar8 = std::operator<<((ostream *)local_ed0,"The dependencies for component \"");
    poVar8 = std::operator<<(poVar8,(string *)&this->Name);
    poVar8 = std::operator<<(poVar8,"\" specify names that contain hyphens. ");
    poVar8 = std::operator<<(poVar8,"This requires QtIFW 3.1 or later, but you are using version ");
    poVar8 = std::operator<<(poVar8,(string *)
                                    &((this->super_cmCPackIFWCommon).Generator)->FrameworkVersion);
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    if ((this->super_cmCPackIFWCommon).Generator != (cmCPackIFWGenerator *)0x0) {
      this_00 = (((this->super_cmCPackIFWCommon).Generator)->super_cmCPackGenerator).Logger;
      std::__cxx11::ostringstream::str();
      msg = (char *)std::__cxx11::string::c_str();
      cmCPackLog::Log(this_00,8,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/IFW/cmCPackIFWPackage.cxx"
                      ,0x2b4,msg);
      std::__cxx11::string::~string
                ((string *)
                 &licenses.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_ed0);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&i,&this->Licenses);
  for (name_3.field_2._8_8_ = 1;
      sVar9 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&i), (ulong)name_3.field_2._8_8_ < sVar9;
      name_3.field_2._8_8_ = name_3.field_2._8_8_ + 2) {
    pvVar10 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&i,name_3.field_2._8_8_);
    cmsys::SystemTools::GetFilenameName((string *)((long)&path_3.field_2 + 8),pvVar10);
    std::operator+(&local_f70,&this->Directory,"/meta/");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f50,
                   &local_f70,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&path_3.field_2 + 8));
    std::__cxx11::string::~string((string *)&local_f70);
    pvVar10 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&i,name_3.field_2._8_8_);
    local_f78 = cmsys::SystemTools::CopyFileIfDifferent(pvVar10,(string *)local_f50);
    pvVar10 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&i,name_3.field_2._8_8_);
    std::__cxx11::string::operator=((string *)pvVar10,(string *)(path_3.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_f50);
    std::__cxx11::string::~string((string *)(path_3.field_2._M_local_buf + 8));
  }
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&i);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f98,"Licenses",(allocator<char> *)((long)&i_1 + 7));
    cmXMLWriter::StartElement((cmXMLWriter *)local_380,&local_f98);
    std::__cxx11::string::~string((string *)&local_f98);
    std::allocator<char>::~allocator((allocator<char> *)((long)&i_1 + 7));
    for (local_fa8 = 0; uVar3 = local_fa8,
        sVar9 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&i), uVar3 < sVar9; local_fa8 = local_fa8 + 2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_fc8,"License",&local_fc9);
      cmXMLWriter::StartElement((cmXMLWriter *)local_380,&local_fc8);
      std::__cxx11::string::~string((string *)&local_fc8);
      std::allocator<char>::~allocator(&local_fc9);
      pvVar10 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&i,local_fa8);
      cmXMLWriter::Attribute<std::__cxx11::string>((cmXMLWriter *)local_380,"name",pvVar10);
      pvVar10 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&i,local_fa8 + 1);
      cmXMLWriter::Attribute<std::__cxx11::string>((cmXMLWriter *)local_380,"file",pvVar10);
      cmXMLWriter::EndElement((cmXMLWriter *)local_380);
    }
    cmXMLWriter::EndElement((cmXMLWriter *)local_380);
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_ff0,"ForcedInstallation",&local_ff1);
    cmXMLWriter::Element<std::__cxx11::string>
              ((cmXMLWriter *)local_380,&local_ff0,&this->ForcedInstallation);
    std::__cxx11::string::~string((string *)&local_ff0);
    std::allocator<char>::~allocator(&local_ff1);
  }
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&this->Replaces);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&it_2);
    local_1178._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(&this->Replaces);
    pbVar11 = __gnu_cxx::
              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator*(&local_1178);
    std::operator<<((ostream *)&it_2,(string *)pbVar11);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_1178);
    while( true ) {
      local_1180._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(&this->Replaces);
      bVar1 = __gnu_cxx::operator!=(&local_1178,&local_1180);
      if (!bVar1) break;
      poVar8 = std::operator<<((ostream *)&it_2,",");
      pbVar11 = __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&local_1178);
      std::operator<<(poVar8,(string *)pbVar11);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_1178);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_11a0,"Replaces",&local_11a1)
    ;
    std::__cxx11::ostringstream::str();
    cmXMLWriter::Element<std::__cxx11::string>((cmXMLWriter *)local_380,&local_11a0,&local_11c8);
    std::__cxx11::string::~string((string *)&local_11c8);
    std::__cxx11::string::~string((string *)&local_11a0);
    std::allocator<char>::~allocator(&local_11a1);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&it_2);
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_11e8,"RequiresAdminRights",&local_11e9);
    cmXMLWriter::Element<std::__cxx11::string>
              ((cmXMLWriter *)local_380,&local_11e8,&this->RequiresAdminRights);
    std::__cxx11::string::~string((string *)&local_11e8);
    std::allocator<char>::~allocator(&local_11e9);
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1210,"Virtual",&local_1211);
    cmXMLWriter::Element<std::__cxx11::string>((cmXMLWriter *)local_380,&local_1210,&this->Virtual);
    std::__cxx11::string::~string((string *)&local_1210);
    std::allocator<char>::~allocator(&local_1211);
  }
  else {
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1238,"Default",&local_1239);
      cmXMLWriter::Element<std::__cxx11::string>
                ((cmXMLWriter *)local_380,&local_1238,&this->Default);
      std::__cxx11::string::~string((string *)&local_1238);
      std::allocator<char>::~allocator(&local_1239);
    }
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1260,"Essential",&local_1261);
    cmXMLWriter::Element<std::__cxx11::string>
              ((cmXMLWriter *)local_380,&local_1260,&this->Essential);
    std::__cxx11::string::~string((string *)&local_1260);
    std::allocator<char>::~allocator(&local_1261);
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1288,"SortingPriority",&local_1289);
    cmXMLWriter::Element<std::__cxx11::string>
              ((cmXMLWriter *)local_380,&local_1288,&this->SortingPriority);
    std::__cxx11::string::~string((string *)&local_1288);
    std::allocator<char>::~allocator(&local_1289);
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_12b0,"Checkable",&local_12b1);
    cmXMLWriter::Element<std::__cxx11::string>
              ((cmXMLWriter *)local_380,&local_12b0,&this->Checkable);
    std::__cxx11::string::~string((string *)&local_12b0);
    std::allocator<char>::~allocator(&local_12b1);
  }
  cmXMLWriter::EndElement((cmXMLWriter *)local_380);
  cmXMLWriter::EndDocument((cmXMLWriter *)local_380);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&i);
  std::
  set<cmCPackIFWPackage::DependenceStruct,_std::less<cmCPackIFWPackage::DependenceStruct>,_std::allocator<cmCPackIFWPackage::DependenceStruct>_>
  ::~set((set<cmCPackIFWPackage::DependenceStruct,_std::less<cmCPackIFWPackage::DependenceStruct>,_std::allocator<cmCPackIFWPackage::DependenceStruct>_>
          *)&__range1_6);
  std::
  set<cmCPackIFWPackage::DependenceStruct,_std::less<cmCPackIFWPackage::DependenceStruct>,_std::allocator<cmCPackIFWPackage::DependenceStruct>_>
  ::~set((set<cmCPackIFWPackage::DependenceStruct,_std::less<cmCPackIFWPackage::DependenceStruct>,_std::allocator<cmCPackIFWPackage::DependenceStruct>_>
          *)&__range1_4);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&__range1_3);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&__range1_2);
  cmXMLWriter::~cmXMLWriter((cmXMLWriter *)local_380);
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_308);
  return;
}

Assistant:

void cmCPackIFWPackage::GeneratePackageFile()
{
  // Lazy directory initialization
  if (this->Directory.empty()) {
    if (this->Installer) {
      this->Directory = this->Installer->Directory + "/packages/" + this->Name;
    } else if (this->Generator) {
      this->Directory = this->Generator->toplevel + "/packages/" + this->Name;
    }
  }

  // Output stream
  cmGeneratedFileStream fout(this->Directory + "/meta/package.xml");
  cmXMLWriter xout(fout);

  xout.StartDocument();

  this->WriteGeneratedByToStrim(xout);

  xout.StartElement("Package");

  // DisplayName (with translations)
  for (auto const& dn : this->DisplayName) {
    xout.StartElement("DisplayName");
    if (!dn.first.empty()) {
      xout.Attribute("xml:lang", dn.first);
    }
    xout.Content(dn.second);
    xout.EndElement();
  }

  // Description (with translations)
  for (auto const& d : this->Description) {
    xout.StartElement("Description");
    if (!d.first.empty()) {
      xout.Attribute("xml:lang", d.first);
    }
    xout.Content(d.second);
    xout.EndElement();
  }

  // Update text
  if (!this->UpdateText.empty()) {
    xout.Element("UpdateText", this->UpdateText);
  }

  xout.Element("Name", this->Name);
  xout.Element("Version", this->Version);

  if (!this->ReleaseDate.empty()) {
    xout.Element("ReleaseDate", this->ReleaseDate);
  } else {
    xout.Element("ReleaseDate", cmTimestamp().CurrentTime("%Y-%m-%d", true));
  }

  // Script (copy to meta dir)
  if (!this->Script.empty()) {
    std::string name = cmSystemTools::GetFilenameName(this->Script);
    std::string path = this->Directory + "/meta/" + name;
    cmsys::SystemTools::CopyFileIfDifferent(this->Script, path);
    xout.Element("Script", name);
  }

  // User Interfaces (copy to meta dir)
  std::vector<std::string> userInterfaces = this->UserInterfaces;
  for (std::string& userInterface : userInterfaces) {
    std::string name = cmSystemTools::GetFilenameName(userInterface);
    std::string path = this->Directory + "/meta/" + name;
    cmsys::SystemTools::CopyFileIfDifferent(userInterface, path);
    userInterface = name;
  }
  if (!userInterfaces.empty()) {
    xout.StartElement("UserInterfaces");
    for (std::string const& userInterface : userInterfaces) {
      xout.Element("UserInterface", userInterface);
    }
    xout.EndElement();
  }

  // Translations (copy to meta dir)
  std::vector<std::string> translations = this->Translations;
  for (std::string& translation : translations) {
    std::string name = cmSystemTools::GetFilenameName(translation);
    std::string path = this->Directory + "/meta/" + name;
    cmsys::SystemTools::CopyFileIfDifferent(translation, path);
    translation = name;
  }
  if (!translations.empty()) {
    xout.StartElement("Translations");
    for (std::string const& translation : translations) {
      xout.Element("Translation", translation);
    }
    xout.EndElement();
  }

  // Dependencies
  const bool hyphensInNamesUnsupported = this->Generator &&
    !this->Generator->FrameworkVersion.empty() && this->IsVersionLess("3.1");
  bool warnUnsupportedNames = false;
  std::set<DependenceStruct> compDepSet;
  for (DependenceStruct* ad : this->AlienDependencies) {
    compDepSet.insert(*ad);
  }
  for (cmCPackIFWPackage* d : this->Dependencies) {
    compDepSet.insert(DependenceStruct(d->Name));
  }
  // Write dependencies
  if (!compDepSet.empty()) {
    std::ostringstream dependencies;
    auto it = compDepSet.begin();
    warnUnsupportedNames |=
      hyphensInNamesUnsupported && it->Name.find('-') != std::string::npos;
    dependencies << it->NameWithCompare();
    ++it;
    while (it != compDepSet.end()) {
      warnUnsupportedNames |=
        hyphensInNamesUnsupported && it->Name.find('-') != std::string::npos;
      dependencies << "," << it->NameWithCompare();
      ++it;
    }
    xout.Element("Dependencies", dependencies.str());
  }

  // Automatic dependency on
  std::set<DependenceStruct> compAutoDepSet;
  for (DependenceStruct* aad : this->AlienAutoDependOn) {
    compAutoDepSet.insert(*aad);
  }
  // Write automatic dependency on
  if (!compAutoDepSet.empty()) {
    std::ostringstream dependencies;
    auto it = compAutoDepSet.begin();
    warnUnsupportedNames |=
      hyphensInNamesUnsupported && it->Name.find('-') != std::string::npos;
    dependencies << it->NameWithCompare();
    ++it;
    while (it != compAutoDepSet.end()) {
      warnUnsupportedNames |=
        hyphensInNamesUnsupported && it->Name.find('-') != std::string::npos;
      dependencies << "," << it->NameWithCompare();
      ++it;
    }
    xout.Element("AutoDependOn", dependencies.str());
  }

  if (warnUnsupportedNames) {
    cmCPackIFWLogger(
      WARNING,
      "The dependencies for component \""
        << this->Name << "\" specify names that contain hyphens. "
        << "This requires QtIFW 3.1 or later, but you are using version "
        << this->Generator->FrameworkVersion << std::endl);
  }

  // Licenses (copy to meta dir)
  std::vector<std::string> licenses = this->Licenses;
  for (size_t i = 1; i < licenses.size(); i += 2) {
    std::string name = cmSystemTools::GetFilenameName(licenses[i]);
    std::string path = this->Directory + "/meta/" + name;
    cmsys::SystemTools::CopyFileIfDifferent(licenses[i], path);
    licenses[i] = name;
  }
  if (!licenses.empty()) {
    xout.StartElement("Licenses");
    for (size_t i = 0; i < licenses.size(); i += 2) {
      xout.StartElement("License");
      xout.Attribute("name", licenses[i]);
      xout.Attribute("file", licenses[i + 1]);
      xout.EndElement();
    }
    xout.EndElement();
  }

  if (!this->ForcedInstallation.empty()) {
    xout.Element("ForcedInstallation", this->ForcedInstallation);
  }

  // Replaces
  if (!this->Replaces.empty()) {
    std::ostringstream replaces;
    auto it = this->Replaces.begin();
    replaces << *it;
    ++it;
    while (it != this->Replaces.end()) {
      replaces << "," << *it;
      ++it;
    }
    xout.Element("Replaces", replaces.str());
  }

  if (!this->RequiresAdminRights.empty()) {
    xout.Element("RequiresAdminRights", this->RequiresAdminRights);
  }

  if (!this->Virtual.empty()) {
    xout.Element("Virtual", this->Virtual);
  } else if (!this->Default.empty()) {
    xout.Element("Default", this->Default);
  }

  // Essential
  if (!this->Essential.empty()) {
    xout.Element("Essential", this->Essential);
  }

  // Priority
  if (!this->SortingPriority.empty()) {
    xout.Element("SortingPriority", this->SortingPriority);
  }

  // Checkable
  if (!this->Checkable.empty()) {
    xout.Element("Checkable", this->Checkable);
  }

  xout.EndElement();
  xout.EndDocument();
}